

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall BronKerbosch::printReads(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  ostream *poVar1;
  AlignmentRecord *this_00;
  ostream *in_RSI;
  long in_RDI;
  size_type j;
  AlignmentRecord *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  string local_40 [32];
  size_type local_20;
  ostream *local_10;
  
  local_10 = in_RSI;
  local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2578b3);
  poVar1 = local_10;
  std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::operator[]
            ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)(in_RDI + 0x40),
             local_20);
  AlignmentRecord::getName_abi_cxx11_(in_stack_ffffffffffffff58);
  std::operator<<(poVar1,local_40);
  std::__cxx11::string::~string(local_40);
  local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  while (local_20 != 0xffffffffffffffff) {
    this_00 = (AlignmentRecord *)std::operator<<(local_10,",");
    std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::operator[]
              ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)(in_RDI + 0x40),
               local_20);
    AlignmentRecord::getName_abi_cxx11_(this_00);
    std::operator<<((ostream *)this_00,(string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BronKerbosch::printReads(std::ostream& os, alignment_set_t set) {
    auto j = set.find_first();
    os << alignments_[j]->getName();

    for (j = set.find_next(j); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << "," << alignments_[j]->getName();
    }
    os << endl;
}